

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O0

Literal * wasm::Literal::makeSignedMax(Literal *__return_storage_ptr__,Type type)

{
  BasicType BVar1;
  int init;
  long init_00;
  Type local_18;
  Type type_local;
  
  local_18.id = type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  BVar1 = wasm::Type::getBasic(&local_18);
  if (BVar1 == i32) {
    init = std::numeric_limits<int>::max();
    Literal(__return_storage_ptr__,init);
  }
  else {
    if (BVar1 != i64) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                         ,0xe3);
    }
    init_00 = std::numeric_limits<long>::max();
    Literal(__return_storage_ptr__,init_00);
  }
  return __return_storage_ptr__;
}

Assistant:

static Literal makeSignedMax(Type type) {
    switch (type.getBasic()) {
      case Type::i32:
        return Literal(std::numeric_limits<int32_t>::max());
      case Type::i64:
        return Literal(std::numeric_limits<int64_t>::max());
      default:
        WASM_UNREACHABLE("unexpected type");
    }
  }